

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

bool rr::anon_unknown_19::isValidCommand(DrawCommand *command,int numInstances)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  TextureChannelClass TVar6;
  GeometryShaderInputType GVar7;
  PrimitiveType PVar8;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *pvVar9;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *pvVar10;
  vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_> *pvVar11;
  size_type sVar12;
  const_reference pvVar13;
  const_reference pvVar14;
  vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_> *pvVar15;
  const_reference pvVar16;
  MultisamplePixelBufferAccess *pMVar17;
  ConstPixelBufferAccess *this;
  TextureFormat *pTVar18;
  GenericVecType local_154;
  ulong local_e8;
  size_t outputNdx_2;
  size_t outputNdx_1;
  GenericVecType colorType;
  TextureChannelClass colorbufferClass;
  size_t varyingNdx_6;
  Vector<int,_4> local_a0;
  MultisampleConstPixelBufferAccess local_90;
  Vector<int,_4> local_64;
  int local_54;
  ulong uStack_50;
  int outputNdx;
  size_t varyingNdx_5;
  size_t varyingNdx_4;
  size_t varyingNdx_3;
  size_t varyingNdx_2;
  size_t varyingNdx_1;
  size_t varyingNdx;
  DrawCommand *pDStack_18;
  int numInstances_local;
  DrawCommand *command_local;
  
  if (numInstances < 1) {
    return false;
  }
  varyingNdx._4_4_ = numInstances;
  pDStack_18 = command;
  if (command->program->geometryShader == (GeometryShader *)0x0) {
    pvVar9 = VertexShader::getOutputs(command->program->vertexShader);
    pvVar10 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
    bVar3 = std::operator!=(pvVar9,pvVar10);
    if (bVar3) {
      return false;
    }
  }
  else {
    pvVar9 = VertexShader::getOutputs(command->program->vertexShader);
    pvVar10 = GeometryShader::getInputs(pDStack_18->program->geometryShader);
    bVar3 = std::operator!=(pvVar9,pvVar10);
    if (bVar3) {
      return false;
    }
    pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
    pvVar10 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
    bVar3 = std::operator!=(pvVar9,pvVar10);
    if (bVar3) {
      return false;
    }
  }
  varyingNdx_1 = 0;
  while( true ) {
    sVar2 = varyingNdx_1;
    pvVar11 = VertexShader::getInputs(pDStack_18->program->vertexShader);
    sVar12 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::size(pvVar11);
    if (sVar12 <= sVar2) break;
    pvVar11 = VertexShader::getInputs(pDStack_18->program->vertexShader);
    pvVar13 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                        (pvVar11,varyingNdx_1);
    if (pvVar13->type != GENERICVECTYPE_FLOAT) {
      pvVar11 = VertexShader::getInputs(pDStack_18->program->vertexShader);
      pvVar13 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                          (pvVar11,varyingNdx_1);
      if (pvVar13->type != GENERICVECTYPE_INT32) {
        pvVar11 = VertexShader::getInputs(pDStack_18->program->vertexShader);
        pvVar13 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::operator[]
                            (pvVar11,varyingNdx_1);
        if (pvVar13->type != GENERICVECTYPE_UINT32) {
          return false;
        }
      }
    }
    varyingNdx_1 = varyingNdx_1 + 1;
  }
  varyingNdx_2 = 0;
  while( true ) {
    sVar2 = varyingNdx_2;
    pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
    sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                       (pvVar9);
    if (sVar12 <= sVar2) break;
    pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
    pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                        (pvVar9,varyingNdx_2);
    if (pvVar14->type != GENERICVECTYPE_FLOAT) {
      pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
      pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](pvVar9,varyingNdx_2);
      if (pvVar14->type != GENERICVECTYPE_INT32) {
        pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
        pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                  operator[](pvVar9,varyingNdx_2);
        if (pvVar14->type != GENERICVECTYPE_UINT32) {
          return false;
        }
      }
    }
    varyingNdx_2 = varyingNdx_2 + 1;
  }
  varyingNdx_3 = 0;
  while( true ) {
    sVar2 = varyingNdx_3;
    pvVar9 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
    sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                       (pvVar9);
    if (sVar12 <= sVar2) break;
    pvVar9 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
    pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                        (pvVar9,varyingNdx_3);
    if (pvVar14->type != GENERICVECTYPE_FLOAT) {
      pvVar9 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
      pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](pvVar9,varyingNdx_3);
      if (pvVar14->type != GENERICVECTYPE_INT32) {
        pvVar9 = FragmentShader::getInputs(pDStack_18->program->fragmentShader);
        pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                  operator[](pvVar9,varyingNdx_3);
        if (pvVar14->type != GENERICVECTYPE_UINT32) {
          return false;
        }
      }
    }
    varyingNdx_3 = varyingNdx_3 + 1;
  }
  varyingNdx_4 = 0;
  while( true ) {
    sVar2 = varyingNdx_4;
    pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
    sVar12 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size
                       (pvVar15);
    if (sVar12 <= sVar2) break;
    pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
    pvVar16 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
              operator[](pvVar15,varyingNdx_4);
    if (pvVar16->type != GENERICVECTYPE_FLOAT) {
      pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
      pvVar16 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
                operator[](pvVar15,varyingNdx_4);
      if (pvVar16->type != GENERICVECTYPE_INT32) {
        pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
        pvVar16 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
                  operator[](pvVar15,varyingNdx_4);
        if (pvVar16->type != GENERICVECTYPE_UINT32) {
          return false;
        }
      }
    }
    varyingNdx_4 = varyingNdx_4 + 1;
  }
  if (pDStack_18->program->geometryShader != (GeometryShader *)0x0) {
    varyingNdx_5 = 0;
    while( true ) {
      sVar2 = varyingNdx_5;
      pvVar9 = GeometryShader::getInputs(pDStack_18->program->geometryShader);
      sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                         (pvVar9);
      if (sVar12 <= sVar2) break;
      pvVar9 = GeometryShader::getInputs(pDStack_18->program->geometryShader);
      pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](pvVar9,varyingNdx_5);
      if (pvVar14->type != GENERICVECTYPE_FLOAT) {
        pvVar9 = GeometryShader::getInputs(pDStack_18->program->geometryShader);
        pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                  operator[](pvVar9,varyingNdx_5);
        if (pvVar14->type != GENERICVECTYPE_INT32) {
          pvVar9 = GeometryShader::getInputs(pDStack_18->program->geometryShader);
          pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                    operator[](pvVar9,varyingNdx_5);
          if (pvVar14->type != GENERICVECTYPE_UINT32) {
            return false;
          }
        }
      }
      varyingNdx_5 = varyingNdx_5 + 1;
    }
    uStack_50 = 0;
    while( true ) {
      uVar1 = uStack_50;
      pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
      sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                         (pvVar9);
      if (sVar12 <= uVar1) break;
      pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
      pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                operator[](pvVar9,uStack_50);
      if (pvVar14->type != GENERICVECTYPE_FLOAT) {
        pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
        pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                  operator[](pvVar9,uStack_50);
        if (pvVar14->type != GENERICVECTYPE_INT32) {
          pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
          pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                    operator[](pvVar9,uStack_50);
          if (pvVar14->type != GENERICVECTYPE_UINT32) {
            return false;
          }
        }
      }
      uStack_50 = uStack_50 + 1;
    }
  }
  iVar4 = pDStack_18->numVertexAttribs;
  pvVar11 = VertexShader::getInputs(pDStack_18->program->vertexShader);
  sVar12 = std::vector<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>::size(pvVar11);
  if ((ulong)(long)iVar4 < sVar12) {
    command_local._7_1_ = false;
  }
  else {
    iVar4 = RenderTarget::getNumColorBuffers(pDStack_18->renderTarget);
    pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
    sVar12 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size
                       (pvVar15);
    if ((ulong)(long)iVar4 < sVar12) {
      command_local._7_1_ = false;
    }
    else {
      for (local_54 = 0; iVar4 = local_54,
          iVar5 = RenderTarget::getNumColorBuffers(pDStack_18->renderTarget), iVar4 < iVar5;
          local_54 = local_54 + 1) {
        pMVar17 = RenderTarget::getColorBuffer(pDStack_18->renderTarget,0);
        MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_90,pMVar17);
        getBufferSize((anon_unknown_19 *)&local_64,&local_90);
        pMVar17 = RenderTarget::getColorBuffer(pDStack_18->renderTarget,local_54);
        MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                  ((MultisampleConstPixelBufferAccess *)&varyingNdx_6,pMVar17);
        getBufferSize((anon_unknown_19 *)&local_a0,
                      (MultisampleConstPixelBufferAccess *)&varyingNdx_6);
        bVar3 = tcu::Vector<int,_4>::operator!=(&local_64,&local_a0);
        if (bVar3) {
          return false;
        }
        iVar4 = RenderTarget::getNumSamples(pDStack_18->renderTarget);
        pMVar17 = RenderTarget::getColorBuffer(pDStack_18->renderTarget,local_54);
        iVar5 = MultisamplePixelBufferAccess::getNumSamples(pMVar17);
        if (iVar4 != iVar5) {
          return false;
        }
      }
      _colorType = 0;
      while( true ) {
        pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
        sVar12 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::size
                           (pvVar15);
        if (sVar12 <= _colorType) break;
        pMVar17 = RenderTarget::getColorBuffer(pDStack_18->renderTarget,(int)_colorType);
        this = &MultisamplePixelBufferAccess::raw(pMVar17)->super_ConstPixelBufferAccess;
        pTVar18 = tcu::ConstPixelBufferAccess::getFormat(this);
        TVar6 = tcu::getTextureChannelClass(pTVar18->type);
        if (TVar6 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
          local_154 = GENERICVECTYPE_INT32;
        }
        else {
          local_154 = (GenericVecType)(TVar6 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
        }
        pvVar15 = FragmentShader::getOutputs(pDStack_18->program->fragmentShader);
        pvVar16 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
                  operator[](pvVar15,_colorType);
        if (pvVar16->type != local_154) {
          return false;
        }
        _colorType = _colorType + 1;
      }
      outputNdx_2 = 0;
      while( true ) {
        pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
        sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                           (pvVar9);
        if (sVar12 <= outputNdx_2) break;
        pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
        pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                  operator[](pvVar9,outputNdx_2);
        if ((pvVar14->flatshade & 1U) == 0) {
          pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
          pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                    operator[](pvVar9,outputNdx_2);
          if (pvVar14->type == GENERICVECTYPE_INT32) {
            return false;
          }
          pvVar9 = VertexShader::getOutputs(pDStack_18->program->vertexShader);
          pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                    operator[](pvVar9,outputNdx_2);
          if (pvVar14->type == GENERICVECTYPE_UINT32) {
            return false;
          }
        }
        outputNdx_2 = outputNdx_2 + 1;
      }
      if (pDStack_18->program->geometryShader != (GeometryShader *)0x0) {
        local_e8 = 0;
        while( true ) {
          pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
          sVar12 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size
                             (pvVar9);
          if (sVar12 <= local_e8) break;
          pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
          pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                    operator[](pvVar9,local_e8);
          if ((pvVar14->flatshade & 1U) == 0) {
            pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
            pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                      operator[](pvVar9,local_e8);
            if (pvVar14->type == GENERICVECTYPE_INT32) {
              return false;
            }
            pvVar9 = GeometryShader::getOutputs(pDStack_18->program->geometryShader);
            pvVar14 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::
                      operator[](pvVar9,local_e8);
            if (pvVar14->type == GENERICVECTYPE_UINT32) {
              return false;
            }
          }
          local_e8 = local_e8 + 1;
        }
      }
      if (pDStack_18->program->geometryShader != (GeometryShader *)0x0) {
        GVar7 = GeometryShader::getInputType(pDStack_18->program->geometryShader);
        if ((GVar7 == GEOMETRYSHADERINPUTTYPE_POINTS) &&
           (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
           PVar8 != PRIMITIVETYPE_POINTS)) {
          return false;
        }
        GVar7 = GeometryShader::getInputType(pDStack_18->program->geometryShader);
        if ((((GVar7 == GEOMETRYSHADERINPUTTYPE_LINES) &&
             (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
             PVar8 != PRIMITIVETYPE_LINES)) &&
            (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_LINE_STRIP)) &&
           (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
           PVar8 != PRIMITIVETYPE_LINE_LOOP)) {
          return false;
        }
        GVar7 = GeometryShader::getInputType(pDStack_18->program->geometryShader);
        if (((GVar7 == GEOMETRYSHADERINPUTTYPE_TRIANGLES) &&
            (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_TRIANGLES)) &&
           ((PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_TRIANGLE_STRIP &&
            (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_TRIANGLE_FAN)))) {
          return false;
        }
        GVar7 = GeometryShader::getInputType(pDStack_18->program->geometryShader);
        if (((GVar7 == GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY) &&
            (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_LINES_ADJACENCY)) &&
           (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
           PVar8 != PRIMITIVETYPE_LINE_STRIP_ADJACENCY)) {
          return false;
        }
        GVar7 = GeometryShader::getInputType(pDStack_18->program->geometryShader);
        if (((GVar7 == GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY) &&
            (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
            PVar8 != PRIMITIVETYPE_TRIANGLES_ADJACENCY)) &&
           (PVar8 = PrimitiveList::getPrimitiveType(pDStack_18->primitives),
           PVar8 != PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY)) {
          return false;
        }
      }
      command_local._7_1_ = true;
    }
  }
  return command_local._7_1_;
}

Assistant:

bool isValidCommand (const DrawCommand& command, int numInstances)
{
	// numInstances should be valid
	if (numInstances < 1)
		return false;

	// Shaders should have the same varyings
	if (command.program.geometryShader)
	{
		if (command.program.vertexShader->getOutputs() != command.program.geometryShader->getInputs())
			return false;

		if (command.program.geometryShader->getOutputs() != command.program.fragmentShader->getInputs())
			return false;
	}
	else
	{
		if (command.program.vertexShader->getOutputs() != command.program.fragmentShader->getInputs())
			return false;
	}

	// Shader input/output types are set
	for (size_t varyingNdx = 0; varyingNdx < command.program.vertexShader->getInputs().size(); ++varyingNdx)
		if (command.program.vertexShader->getInputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
			command.program.vertexShader->getInputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
			command.program.vertexShader->getInputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
			return false;
	for (size_t varyingNdx = 0; varyingNdx < command.program.vertexShader->getOutputs().size(); ++varyingNdx)
		if (command.program.vertexShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
			command.program.vertexShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
			command.program.vertexShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
			return false;

	for (size_t varyingNdx = 0; varyingNdx < command.program.fragmentShader->getInputs().size(); ++varyingNdx)
		if (command.program.fragmentShader->getInputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
			command.program.fragmentShader->getInputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
			command.program.fragmentShader->getInputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
			return false;
	for (size_t varyingNdx = 0; varyingNdx < command.program.fragmentShader->getOutputs().size(); ++varyingNdx)
		if (command.program.fragmentShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
			command.program.fragmentShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
			command.program.fragmentShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
			return false;

	if (command.program.geometryShader)
	{
		for (size_t varyingNdx = 0; varyingNdx < command.program.geometryShader->getInputs().size(); ++varyingNdx)
			if (command.program.geometryShader->getInputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
				command.program.geometryShader->getInputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
				command.program.geometryShader->getInputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
				return false;
		for (size_t varyingNdx = 0; varyingNdx < command.program.geometryShader->getOutputs().size(); ++varyingNdx)
			if (command.program.geometryShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_FLOAT &&
				command.program.geometryShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_INT32 &&
				command.program.geometryShader->getOutputs()[varyingNdx].type != GENERICVECTYPE_UINT32)
				return false;
	}

	// Enough vertex inputs?
	if ((size_t)command.numVertexAttribs < command.program.vertexShader->getInputs().size())
		return false;

	// There is a fragment output sink for each output?
	if ((size_t)command.renderTarget.getNumColorBuffers() < command.program.fragmentShader->getOutputs().size())
		return false;

	// All destination buffers should have same number of samples and same size
	for (int outputNdx = 0; outputNdx < command.renderTarget.getNumColorBuffers(); ++outputNdx)
	{
		if (getBufferSize(command.renderTarget.getColorBuffer(0)) != getBufferSize(command.renderTarget.getColorBuffer(outputNdx)))
			return false;

		if (command.renderTarget.getNumSamples() != command.renderTarget.getColorBuffer(outputNdx).getNumSamples())
			return false;
	}

	// All destination buffers should have same basic type as matching fragment output
	for (size_t varyingNdx = 0; varyingNdx < command.program.fragmentShader->getOutputs().size(); ++varyingNdx)
	{
		const tcu::TextureChannelClass	colorbufferClass = tcu::getTextureChannelClass(command.renderTarget.getColorBuffer((int)varyingNdx).raw().getFormat().type);
		const GenericVecType			colorType		 = (colorbufferClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER) ? (rr::GENERICVECTYPE_INT32) : ((colorbufferClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER) ? (rr::GENERICVECTYPE_UINT32) : (rr::GENERICVECTYPE_FLOAT));

		if (command.program.fragmentShader->getOutputs()[varyingNdx].type != colorType)
			return false;
	}

	// Integer values are flatshaded
	for (size_t outputNdx = 0; outputNdx < command.program.vertexShader->getOutputs().size(); ++outputNdx)
	{
		if (!command.program.vertexShader->getOutputs()[outputNdx].flatshade &&
			(command.program.vertexShader->getOutputs()[outputNdx].type == GENERICVECTYPE_INT32 ||
			 command.program.vertexShader->getOutputs()[outputNdx].type == GENERICVECTYPE_UINT32))
			return false;
	}
	if (command.program.geometryShader)
		for (size_t outputNdx = 0; outputNdx < command.program.geometryShader->getOutputs().size(); ++outputNdx)
		{
			if (!command.program.geometryShader->getOutputs()[outputNdx].flatshade &&
				(command.program.geometryShader->getOutputs()[outputNdx].type == GENERICVECTYPE_INT32 ||
				 command.program.geometryShader->getOutputs()[outputNdx].type == GENERICVECTYPE_UINT32))
				return false;
		}

	// Draw primitive is valid for geometry shader
	if (command.program.geometryShader)
	{
		if (command.program.geometryShader->getInputType() == rr::GEOMETRYSHADERINPUTTYPE_POINTS && command.primitives.getPrimitiveType() != PRIMITIVETYPE_POINTS)
			return false;

		if (command.program.geometryShader->getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES &&
			(command.primitives.getPrimitiveType() != PRIMITIVETYPE_LINES &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_LINE_STRIP &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_LINE_LOOP))
			return false;

		if (command.program.geometryShader->getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES &&
			(command.primitives.getPrimitiveType() != PRIMITIVETYPE_TRIANGLES &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_TRIANGLE_STRIP &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_TRIANGLE_FAN))
			return false;

		if (command.program.geometryShader->getInputType() == rr::GEOMETRYSHADERINPUTTYPE_LINES_ADJACENCY &&
			(command.primitives.getPrimitiveType() != PRIMITIVETYPE_LINES_ADJACENCY &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_LINE_STRIP_ADJACENCY))
			return false;

		if (command.program.geometryShader->getInputType() == rr::GEOMETRYSHADERINPUTTYPE_TRIANGLES_ADJACENCY &&
			(command.primitives.getPrimitiveType() != PRIMITIVETYPE_TRIANGLES_ADJACENCY &&
			 command.primitives.getPrimitiveType() != PRIMITIVETYPE_TRIANGLE_STRIP_ADJACENCY))
			return false;
	}

	return true;
}